

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall lsim::gui::CircuitEditor::refresh(CircuitEditor *this,UIContext *ui_context)

{
  ImVec2 local_20;
  UIContext *local_18;
  UIContext *ui_context_local;
  CircuitEditor *this_local;
  
  local_18 = ui_context;
  ui_context_local = (UIContext *)this;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  ImGui::BeginChild("scrolling_region",&local_20,true,0x1c);
  init_ui_refresh(this);
  draw_ui(this,local_18);
  user_interaction(this);
  ImGui::EndChild();
  return;
}

Assistant:

void CircuitEditor::refresh(UIContext *ui_context) {

	ImGui::BeginChild("scrolling_region", ImVec2(0, 0), true, ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollWithMouse);
	init_ui_refresh();
	draw_ui(ui_context);
	user_interaction();
	ImGui::EndChild();	// scrolling region
}